

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::ConcatArgs<unsigned_int>
               (RecyclableObject *pDestObj,TypeId *remoteTypeIds,Arguments *args,
               ScriptContext *scriptContext,uint start,uint startIdxDest,
               ConcatSpreadableState previousItemSpreadableState,BigIndex *firstPromotedItemLength)

{
  bool bVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  int succeeded;
  BOOL BVar5;
  uint uVar6;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptArray *pJVar9;
  RecyclableObject *object;
  uint64 uVar10;
  uint start_00;
  ScriptContext *scriptContext_00;
  undefined4 in_register_00000084;
  ulong uVar11;
  undefined4 in_register_0000008c;
  Arguments *this;
  uint32 index;
  BigIndex BVar12;
  PropertyRecord *local_c0;
  PropertyRecord *propertyRecord;
  RecyclableObject *local_b0;
  undefined4 *local_a8;
  Arguments *local_a0;
  undefined1 auStack_98 [8];
  BigIndex length;
  undefined1 auStack_70 [8];
  BigIndex idxSubItem;
  JsReentLock jsReentLock;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_0000008c,startIdxDest);
  uVar11 = CONCAT44(in_register_00000084,start);
  idxSubItem.bigIndex = (uint64)scriptContext->threadContext;
  bVar1 = ((ThreadContext *)idxSubItem.bigIndex)->noJsReentrancy;
  ((ThreadContext *)idxSubItem.bigIndex)->noJsReentrancy = true;
  scriptContext_00 = (ScriptContext *)remoteTypeIds;
  local_a0 = args;
  bVar3 = IsNonES5Array(pDestObj);
  if ((bVar3) &&
     (jsReentLock._24_8_ = UnsafeVarTo<Js::JavascriptArray>(pDestObj),
     (ScriptContext *)jsReentLock._24_8_ != (ScriptContext *)0x0)) {
    EnsureNonNativeArray((JavascriptArray *)jsReentLock._24_8_);
    scriptContext_00 = (ScriptContext *)jsReentLock._24_8_;
    JsReentLock::setSecondObjectForMutation
              ((JsReentLock *)&idxSubItem.bigIndex,(Var)jsReentLock._24_8_);
  }
  else {
    jsReentLock.m_savedNoJsReentrancy = false;
    jsReentLock._25_7_ = 0;
  }
  if (((scriptContext->config).threadConfig)->m_ES6IsConcatSpreadable == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    scriptContext_00 = (ScriptContext *)0xcb4;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xcb4,
                                "(scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled())",
                                "scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled()");
    if (!bVar3) {
LAB_00b88bf3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  this = local_a0;
  if (start < (*(uint *)&local_a0->Info & 0xffffff)) {
    local_a8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    scriptContext_00 = (ScriptContext *)(ulong)start;
    local_b0 = pDestObj;
    do {
      start_00 = (uint)scriptContext_00;
      pvVar8 = Arguments::operator[](this,start_00);
      JsReentLock::setObjectForMutation((JsReentLock *)&idxSubItem.bigIndex,pvVar8);
      if (previousItemSpreadableState == ConcatSpreadableState_NotChecked) {
        *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
        BVar5 = JavascriptOperators::IsConcatSpreadable(pvVar8);
        JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
        *(undefined1 *)(idxSubItem.bigIndex + 0x108) = 1;
        if (BVar5 == 0) goto LAB_00b88649;
LAB_00b8856f:
        if (((jsReentLock._24_8_ == 0) || (bVar3 = IsDirectAccessArray(pvVar8), !bVar3)) ||
           (bVar3 = IsDirectAccessArray((Var)jsReentLock._24_8_), !bVar3)) {
LAB_00b885c4:
          bVar3 = VarIs<Js::RecyclableObject>(pvVar8);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_a8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0xce8,"(VarIs<RecyclableObject>(aItem))",
                                        "VarIs<RecyclableObject>(aItem)");
            if (!bVar3) goto LAB_00b88bf3;
            *local_a8 = 0;
          }
          BigIndex::BigIndex((BigIndex *)auStack_98,0);
          if (firstPromotedItemLength == (BigIndex *)0x0) {
            *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
            uVar10 = OP_GetLength(pvVar8,scriptContext);
            BigIndex::BigIndex((BigIndex *)auStack_70,uVar10);
            auStack_98._4_4_ = auStack_70._4_4_;
            auStack_98._0_4_ = auStack_70._0_4_;
            length.index = idxSubItem.index;
            length._4_4_ = idxSubItem._4_4_;
            JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
            *(undefined1 *)(idxSubItem.bigIndex + 0x108) = 1;
          }
          else {
            auStack_98._0_4_ = firstPromotedItemLength->index;
            auStack_98._4_4_ = *(undefined4 *)&firstPromotedItemLength->field_0x4;
            length._0_8_ = firstPromotedItemLength->bigIndex;
          }
          auStack_70._0_4_ = auStack_98._0_4_;
          idxSubItem.index = length.index;
          idxSubItem._4_4_ = length._4_4_;
          if ((auStack_98._0_4_ == 0xffffffff) ||
             (uVar4 = BigIndex::GetSmallIndex((BigIndex *)auStack_70), CARRY4(uVar4,(uint)local_38))
             ) {
            *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
            ConcatArgs<Js::JavascriptArray::BigIndex>
                      (pDestObj,remoteTypeIds,local_a0,scriptContext,start_00,(uint)local_38,
                       ConcatSpreadableState_CheckedAndTrue,(BigIndex *)auStack_98);
            JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
            goto LAB_00b88bba;
          }
          BVar12 = BigIndex::operator+((BigIndex *)auStack_98,(uint)local_38);
          idxSubItem._0_8_ = BVar12.bigIndex;
          auStack_70._0_4_ = BVar12.index;
          BigIndex::BigIndex((BigIndex *)&stack0xffffffffffffff40,0x1fffffffffffff);
          bVar3 = BigIndex::operator>((BigIndex *)auStack_70,(BigIndex *)&stack0xffffffffffffff40);
          if (bVar3) {
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec09,(PCWSTR)0x0);
          }
          object = VarTo<Js::RecyclableObject>(pvVar8);
          if (auStack_98._0_4_ == 0xffffffff) {
            uVar4 = 0xffffffff;
LAB_00b88778:
            index = 0;
            do {
              *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
              BVar5 = JavascriptOperators::HasItem(object,index);
              JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
              *(undefined1 *)(idxSubItem.bigIndex + 0x108) = 1;
              if (BVar5 != 0) {
                *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
                pvVar8 = JavascriptOperators::GetItem(object,index,scriptContext);
                JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
                uVar6 = (uint)local_38 + index;
                *(undefined1 *)(idxSubItem.bigIndex + 0x108) = 1;
                if (jsReentLock._24_8_ == 0) {
                  *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
                  succeeded = (*(local_b0->super_FinalizableObject).super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject[0x29])(local_b0,(ulong)uVar6,pvVar8,4);
                  ThrowErrorOnFailure(succeeded,scriptContext,uVar6);
                  JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
                  *(undefined1 *)(idxSubItem.bigIndex + 0x108) = 1;
                }
                else {
                  pvVar8 = CrossSite::MarshalVar
                                     (*(ScriptContext **)
                                       (*(long *)(*(long *)(jsReentLock._24_8_ + 8) + 8) + 0x490),
                                      pvVar8,false);
                  DirectSetItemAt<void*>((JavascriptArray *)jsReentLock._24_8_,uVar6,pvVar8);
                }
              }
              index = index + 1;
            } while (uVar4 != index);
            local_38 = (ulong)((uint)local_38 + index);
            pDestObj = local_b0;
          }
          else {
            uVar4 = BigIndex::GetSmallIndex((BigIndex *)auStack_98);
            if (uVar4 != 0) goto LAB_00b88778;
          }
          BigIndex::BigIndex((BigIndex *)auStack_70,0xffffffff);
          while( true ) {
            bVar3 = BigIndex::operator<((BigIndex *)auStack_70,(BigIndex *)auStack_98);
            if (!bVar3) break;
            uVar10 = BigIndex::GetBigIndex((BigIndex *)auStack_70);
            JavascriptOperators::GetPropertyIdForInt(uVar10,scriptContext,&stack0xffffffffffffff40);
            *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
            BVar5 = JavascriptOperators::HasProperty(object,local_c0->pid);
            JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
            *(undefined1 *)(idxSubItem.bigIndex + 0x108) = 1;
            if (BVar5 != 0) {
              *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
              pvVar8 = JavascriptOperators::GetProperty
                                 (object,local_c0->pid,scriptContext,(PropertyValueInfo *)0x0);
              JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
              *(undefined1 *)(idxSubItem.bigIndex + 0x108) = 1;
              if (jsReentLock._24_8_ == 0) {
                *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
                uVar6 = (*(pDestObj->super_FinalizableObject).super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject[0x29])(pDestObj,local_38,pvVar8,4);
                BVar12.bigIndex = uVar11;
                BVar12.index = idxSubItem.index;
                BVar12._4_4_ = idxSubItem._4_4_;
                ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar6,(BOOL)scriptContext,
                                    (ScriptContext *)(ulong)(uint)auStack_70._0_4_,BVar12);
                JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
                *(undefined1 *)(idxSubItem.bigIndex + 0x108) = 1;
              }
              else {
                pvVar8 = CrossSite::MarshalVar
                                   (*(ScriptContext **)
                                     (*(long *)(*(long *)(jsReentLock._24_8_ + 8) + 8) + 0x490),
                                    pvVar8,false);
                DirectSetItemAt<void*>
                          ((JavascriptArray *)jsReentLock._24_8_,(uint32)local_38,pvVar8);
              }
            }
            if (auStack_70._0_4_ == 0xffffffff) {
              idxSubItem._0_8_ = idxSubItem._0_8_ + 1;
            }
            else {
              auStack_70._0_4_ = auStack_70._0_4_ + 1;
            }
            local_38 = (ulong)((uint32)local_38 + 1);
          }
        }
        else {
          pJVar9 = UnsafeVarTo<Js::JavascriptArray>(pvVar8);
          BigIndex::BigIndex((BigIndex *)auStack_70,
                             (pJVar9->super_ArrayObject).length + (uint)local_38);
          if (auStack_70._0_4_ == 0xffffffff) goto LAB_00b885c4;
          pJVar9 = UnsafeVarTo<Js::JavascriptArray>(pvVar8);
          bVar3 = IsFillFromPrototypes(pJVar9);
          if (bVar3) goto LAB_00b885c4;
          bVar3 = VarIs<Js::JavascriptNativeIntArray>(pvVar8);
          if ((bVar3) &&
             (pJVar9 = (JavascriptArray *)UnsafeVarTo<Js::JavascriptNativeIntArray>(pvVar8),
             pJVar9 != (JavascriptArray *)0x0)) {
            *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
            BigIndex::BigIndex((BigIndex *)auStack_70,(uint)local_38);
            uVar4 = BigIndex::GetSmallIndex((BigIndex *)auStack_70);
            uVar11 = 0xffffffff;
            CopyNativeIntArrayElementsToVar
                      ((JavascriptArray *)jsReentLock._24_8_,uVar4,
                       (JavascriptNativeIntArray *)pJVar9,0,0xffffffff);
          }
          else {
            bVar3 = VarIs<Js::JavascriptNativeFloatArray>(pvVar8);
            if ((bVar3) &&
               (pJVar9 = (JavascriptArray *)UnsafeVarTo<Js::JavascriptNativeFloatArray>(pvVar8),
               pJVar9 != (JavascriptArray *)0x0)) {
              *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
              BigIndex::BigIndex((BigIndex *)auStack_70,(uint)local_38);
              uVar4 = BigIndex::GetSmallIndex((BigIndex *)auStack_70);
              uVar11 = 0xffffffff;
              CopyNativeFloatArrayElementsToVar
                        ((JavascriptArray *)jsReentLock._24_8_,uVar4,
                         (JavascriptNativeFloatArray *)pJVar9,0,0xffffffff);
            }
            else {
              pJVar9 = UnsafeVarTo<Js::JavascriptArray>(pvVar8);
              *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
              BigIndex::BigIndex((BigIndex *)auStack_70,(uint)local_38);
              uVar4 = BigIndex::GetSmallIndex((BigIndex *)auStack_70);
              uVar11 = 0xffffffff;
              CopyArrayElements((JavascriptArray *)jsReentLock._24_8_,uVar4,pJVar9,0,0xffffffff);
              JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
            }
          }
          *(undefined1 *)(idxSubItem.bigIndex + 0x108) = 1;
          local_38 = (ulong)((uint)local_38 +
                            (((JavascriptNativeArray *)&pJVar9->super_ArrayObject)->
                            super_JavascriptArray).super_ArrayObject.length);
        }
        firstPromotedItemLength = (BigIndex *)0x0;
      }
      else {
        if (previousItemSpreadableState == ConcatSpreadableState_CheckedAndTrue) goto LAB_00b8856f;
LAB_00b88649:
        *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
        uVar11 = local_38;
        SetConcatItem<unsigned_int>
                  (pvVar8,start_00,(JavascriptArray *)jsReentLock._24_8_,pDestObj,(uint)local_38,
                   scriptContext);
        JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
        *(undefined1 *)(idxSubItem.bigIndex + 0x108) = 1;
        local_38 = (ulong)((uint)local_38 + 1);
      }
      scriptContext_00 = (ScriptContext *)(ulong)(start_00 + 1);
      previousItemSpreadableState = ConcatSpreadableState_NotChecked;
      this = local_a0;
    } while (start_00 + 1 < (*(uint *)&local_a0->Info & 0xffffff));
  }
  uVar4 = (uint32)local_38;
  if (jsReentLock._24_8_ == 0) {
    *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
    pvVar8 = ConvertToIndex<unsigned_int,void*>(uVar4,scriptContext_00);
    (*(pDestObj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x17])(pDestObj,0xd1,pvVar8,0,0);
    JsReentLock::MutateArrayObject((JsReentLock *)&idxSubItem.bigIndex);
LAB_00b88bba:
    *(undefined1 *)(idxSubItem.bigIndex + 0x108) = 1;
  }
  else if (*(uint32 *)(jsReentLock._24_8_ + 0x20) != uVar4) {
    SetLength((JavascriptArray *)jsReentLock._24_8_,uVar4);
  }
  *(bool *)(idxSubItem.bigIndex + 0x108) = bVar1;
  return;
}

Assistant:

void JavascriptArray::ConcatArgs(RecyclableObject* pDestObj, TypeId* remoteTypeIds,
        Js::Arguments& args, ScriptContext* scriptContext, uint start, uint startIdxDest,
        ConcatSpreadableState previousItemSpreadableState /*= ConcatSpreadableState_NotChecked*/, BigIndex *firstPromotedItemLength /* = nullptr */)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        JavascriptArray* pDestArray = JavascriptArray::TryVarToNonES5Array(pDestObj);
        if (pDestArray)
        {
            // ConcatArgs function expects to work on the Var array so we are ensuring it.
            pDestArray = EnsureNonNativeArray(pDestArray);
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pDestArray);
        }

        AssertOrFailFast(scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled()); // ConcatSpreadable is enabled already - not going back.

        T idxDest = startIdxDest;
        for (uint idxArg = start; idxArg < args.Info.Count; idxArg++)
        {
            Var aItem = args[idxArg];
            SETOBJECT_FOR_MUTATION(jsReentLock, aItem);

            bool spreadable = previousItemSpreadableState == ConcatSpreadableState_CheckedAndTrue;

            if (previousItemSpreadableState == ConcatSpreadableState_NotChecked)
            {
                JS_REENTRANT(jsReentLock, spreadable = !!JavascriptOperators::IsConcatSpreadable(aItem));
            }

            // Reset the state for the next item in the array
            previousItemSpreadableState = ConcatSpreadableState_NotChecked;

            if (!spreadable)
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::SetConcatItem<T>(aItem, idxArg, pDestArray, pDestObj, idxDest, scriptContext));
                ++idxDest;
                continue;
            }

            if (pDestArray && JavascriptArray::IsDirectAccessArray(aItem) && JavascriptArray::IsDirectAccessArray(pDestArray)
                && BigIndex(idxDest + UnsafeVarTo<JavascriptArray>(aItem)->length).IsSmallIndex() && !UnsafeVarTo<JavascriptArray>(aItem)->IsFillFromPrototypes()) // Fast path
            {
                JavascriptNativeIntArray *pIntItemArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(aItem);
                if (pIntItemArray)
                {
                    JS_REENTRANT_NO_MUTATE(jsReentLock, CopyNativeIntArrayElementsToVar(pDestArray, BigIndex(idxDest).GetSmallIndex(), pIntItemArray));
                    idxDest = idxDest + pIntItemArray->length;
                }
                else
                {
                    JavascriptNativeFloatArray *pFloatItemArray = JavascriptOperators::TryFromVar<JavascriptNativeFloatArray>(aItem);
                    if (pFloatItemArray)
                    {
                        JS_REENTRANT_NO_MUTATE(jsReentLock, CopyNativeFloatArrayElementsToVar(pDestArray, BigIndex(idxDest).GetSmallIndex(), pFloatItemArray));
                        idxDest = idxDest + pFloatItemArray->length;
                    }
                    else
                    {
                        JavascriptArray* pItemArray = UnsafeVarTo<JavascriptArray>(aItem);
                        JS_REENTRANT(jsReentLock, CopyArrayElements(pDestArray, BigIndex(idxDest).GetSmallIndex(), pItemArray));
                        idxDest = idxDest + pItemArray->length;
                    }
                }
            }
            else
            {
                AssertOrFailFast(VarIs<RecyclableObject>(aItem));

                //CONSIDER: enumerating remote array instead of walking all indices
                BigIndex length;
                if (firstPromotedItemLength != nullptr)
                {
                    length = *firstPromotedItemLength;
                }
                else
                {
                    JS_REENTRANT(jsReentLock, length = OP_GetLength(aItem, scriptContext));
                }

                if (PromoteToBigIndex(length, idxDest))
                {
                    // This is a special case for spreadable objects. We do not pre-calculate the length
                    // in EntryConcat like we do with Arrays because a getProperty on an object Length
                    // is observable. The result is we have to check for overflows separately for
                    // spreadable objects and promote to a bigger index type when we find them.
                    JS_REENTRANT(jsReentLock, ConcatArgs<BigIndex>(pDestObj, remoteTypeIds, args, scriptContext, idxArg, idxDest, ConcatSpreadableState_CheckedAndTrue, &length));
                    return;
                }

                if (length + idxDest > FiftyThirdPowerOfTwoMinusOne) // 2^53-1: from ECMA 22.1.3.1 Array.prototype.concat(...arguments)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_IllegalArraySizeAndLength);
                }

                RecyclableObject* itemObject = VarTo<RecyclableObject>(aItem);
                Var subItem;
                uint32 lengthToUin32Max = length.IsSmallIndex() ? length.GetSmallIndex() : MaxArrayLength;
                for (uint32 idxSubItem = 0u; idxSubItem < lengthToUin32Max; ++idxSubItem)
                {
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(itemObject, idxSubItem));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, subItem = JavascriptOperators::GetItem(itemObject, idxSubItem, scriptContext));

                        if (pDestArray)
                        {
                            pDestArray->GenericDirectSetItemAt(idxDest, subItem);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(SetArrayLikeObjects(pDestObj, idxDest, subItem), scriptContext, idxDest));
                        }
                    }
                    ++idxDest;
                }

                for (BigIndex idxSubItem = MaxArrayLength; idxSubItem < length; ++idxSubItem)
                {
                    PropertyRecord const * propertyRecord;
                    JavascriptOperators::GetPropertyIdForInt(idxSubItem.GetBigIndex(), scriptContext, &propertyRecord);
                    JS_REENTRANT(jsReentLock, BOOL hasProp = JavascriptOperators::HasProperty(itemObject, propertyRecord->GetPropertyId()));
                    if (hasProp)
                    {
                        JS_REENTRANT(jsReentLock, subItem = JavascriptOperators::GetProperty(itemObject, propertyRecord->GetPropertyId(), scriptContext));
                        if (pDestArray)
                        {
                            pDestArray->GenericDirectSetItemAt(idxDest, subItem);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(SetArrayLikeObjects(pDestObj, idxDest, subItem), scriptContext, idxSubItem));
                        }
                    }
                    ++idxDest;
                }
            }

            firstPromotedItemLength = nullptr;
        }

        if (!pDestArray)
        {
            JS_REENTRANT(jsReentLock, pDestObj->SetProperty(PropertyIds::length, ConvertToIndex<T, Var>(idxDest, scriptContext), Js::PropertyOperation_None, nullptr));
        }
        else if (pDestArray->GetLength() != ConvertToIndex<T, uint32>(idxDest, scriptContext))
        {
            pDestArray->SetLength(ConvertToIndex<T, uint32>(idxDest, scriptContext));
        }
    }